

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O3

size_t __thiscall google::protobuf::StringValue::ByteSizeLong(StringValue *this)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  
  lVar1 = *(long *)(((ulong)(this->field_0)._impl_.value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc) + 8
                   );
  if (lVar1 == 0) {
    sVar4 = 0;
  }
  else {
    uVar3 = (uint)lVar1 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar4,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

uintptr_t as_int() const { return reinterpret_cast<uintptr_t>(ptr_); }